

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O0

void __thiscall
common_params_print_usage::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,
          vector<common_arg_*,_std::allocator<common_arg_*>_> *options)

{
  bool bVar1;
  reference ppcVar2;
  undefined8 uVar3;
  common_arg *opt;
  iterator __end2;
  iterator __begin2;
  vector<common_arg_*,_std::allocator<common_arg_*>_> *__range2;
  common_arg *in_stack_00000388;
  vector<common_arg_*,_std::allocator<common_arg_*>_> *in_stack_ffffffffffffff98;
  __normal_iterator<common_arg_**,_std::vector<common_arg_*,_std::allocator<common_arg_*>_>_>
  *in_stack_ffffffffffffffa0;
  vector<common_arg_*,_std::allocator<common_arg_*>_> local_50;
  common_arg *local_30;
  common_arg **local_28;
  __normal_iterator<common_arg_**,_std::vector<common_arg_*,_std::allocator<common_arg_*>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (common_arg **)
       std::vector<common_arg_*,_std::allocator<common_arg_*>_>::begin(in_stack_ffffffffffffff98);
  local_28 = (common_arg **)
             std::vector<common_arg_*,_std::allocator<common_arg_*>_>::end
                       (in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffa0,
                       (__normal_iterator<common_arg_**,_std::vector<common_arg_*,_std::allocator<common_arg_*>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<common_arg_**,_std::vector<common_arg_*,_std::allocator<common_arg_*>_>_>
              ::operator*(local_20);
    local_30 = *ppcVar2;
    in_stack_ffffffffffffff98 = &local_50;
    common_arg::to_string_abi_cxx11_(in_stack_00000388);
    uVar3 = std::__cxx11::string::c_str();
    printf("%s",uVar3);
    std::__cxx11::string::~string((string *)&local_50);
    __gnu_cxx::
    __normal_iterator<common_arg_**,_std::vector<common_arg_*,_std::allocator<common_arg_*>_>_>::
    operator++(local_20);
  }
  return;
}

Assistant:

static void common_params_print_usage(common_params_context & ctx_arg) {
    auto print_options = [](std::vector<common_arg *> & options) {
        for (common_arg * opt : options) {
            printf("%s", opt->to_string().c_str());
        }
    };

    std::vector<common_arg *> common_options;
    std::vector<common_arg *> sparam_options;
    std::vector<common_arg *> specific_options;
    for (auto & opt : ctx_arg.options) {
        // in case multiple LLAMA_EXAMPLE_* are set, we prioritize the LLAMA_EXAMPLE_* matching current example
        if (opt.is_sparam) {
            sparam_options.push_back(&opt);
        } else if (opt.in_example(ctx_arg.ex)) {
            specific_options.push_back(&opt);
        } else {
            common_options.push_back(&opt);
        }
    }
    printf("----- common params -----\n\n");
    print_options(common_options);
    printf("\n\n----- sampling params -----\n\n");
    print_options(sparam_options);
    // TODO: maybe convert enum llama_example to string
    printf("\n\n----- example-specific params -----\n\n");
    print_options(specific_options);
}